

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

FILE * OpenFileOrDie(char *filename,char *mode)

{
  ostream *poVar1;
  ostream *poVar2;
  char *in_RSI;
  char *in_RDI;
  FILE *input_stream;
  Logger *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int line;
  string *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  LogSeverity severity;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [36];
  Logger local_d4;
  FILE *local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  char *local_10;
  char *local_8;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  if (in_RDI == (char *)0x0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"OpenFileOrDie",&local_71);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffea8,line,in_stack_fffffffffffffe98);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x89);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"filename");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffe30);
    abort();
  }
  if (in_RSI == (char *)0x0) {
    Logger::Logger(&local_78,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"OpenFileOrDie",&local_c1);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffea8,line,in_stack_fffffffffffffe98);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x8a);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"mode");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    Logger::~Logger(in_stack_fffffffffffffe30);
    abort();
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_d0 = fopen(in_RDI,in_RSI);
  if (local_d0 == (FILE *)0x0) {
    Logger::Logger(&local_d4,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"OpenFileOrDie",&local_121);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffea8,line,in_stack_fffffffffffffe98);
    poVar2 = std::operator<<(poVar1,"Cannot open file: ");
    poVar2 = std::operator<<(poVar2,local_8);
    poVar2 = std::operator<<(poVar2," with mode: ");
    std::operator<<(poVar2,local_10);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    Logger::~Logger((Logger *)poVar1);
  }
  return (FILE *)local_d0;
}

Assistant:

inline FILE *OpenFileOrDie(const char *filename, const char *mode) {
  CHECK_NOTNULL(filename);
  CHECK_NOTNULL(mode);
  FILE *input_stream = fopen(filename, mode);
  if (input_stream == nullptr) {
    LOG(FATAL) << "Cannot open file: " << filename
               << " with mode: " << mode;
  }  
  return input_stream;
}